

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::IsInPlane(ON_PolylineCurve *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  ON_NurbsCurve nurbs_curve;
  ON_NurbsCurve local_58;
  
  ON_NurbsCurve::ON_NurbsCurve(&local_58);
  local_58.m_dim = this->m_dim;
  local_58.m_is_rat = 0;
  local_58.m_order = 2;
  local_58.m_cv_count =
       (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (local_58.m_cv_count < 2) {
    bVar1 = false;
  }
  else {
    local_58.m_cv = &((this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a)->x
    ;
    local_58.m_cv_stride = 3;
    local_58.m_knot = (this->m_t).m_a;
    bVar1 = ON_NurbsCurve::IsInPlane(&local_58,plane,tolerance);
    local_58.m_cv = (double *)0x0;
    local_58.m_knot = (double *)0x0;
  }
  ON_NurbsCurve::~ON_NurbsCurve(&local_58);
  return bVar1;
}

Assistant:

bool
ON_PolylineCurve::IsInPlane(
      const ON_Plane& plane, // plane to test
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  ON_NurbsCurve nurbs_curve;
  nurbs_curve.m_dim = m_dim;
  nurbs_curve.m_is_rat = 0;
  nurbs_curve.m_order = 2;
  nurbs_curve.m_cv_count = m_pline.Count();
  if ( nurbs_curve.m_cv_count >= 2 )
  {
    nurbs_curve.m_cv = const_cast<double*>(&m_pline[0].x);
    nurbs_curve.m_cv_stride = (int)(&m_pline[1].x - nurbs_curve.m_cv);
    nurbs_curve.m_knot = const_cast<double*>(m_t.Array());
    rc = nurbs_curve.IsInPlane(plane,tolerance);
    nurbs_curve.m_cv = 0;
    nurbs_curve.m_knot = 0;
  }
  return rc;
}